

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O3

section_t * get_section_by_id(int id)

{
  section_s *psVar1;
  
  psVar1 = root;
  while( true ) {
    if (psVar1 == (section_t *)0x0) {
      return (section_t *)0x0;
    }
    if (psVar1->id == id) break;
    psVar1 = psVar1->next;
  }
  return psVar1;
}

Assistant:

section_t* get_section_by_id(int id)
{
    section_t* ps = root;
    while (ps)
    {
        if (ps->id == id)
            break;
        ps = ps->next;
    }
    return ps;
}